

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * strGetOption_abi_cxx11_(char *message)

{
  char *in_RSI;
  char *message_local;
  string *temp;
  
  std::__cxx11::string::string((string *)message);
  std::operator<<((ostream *)&std::cout,in_RSI);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)message);
  return message;
}

Assistant:

std::string strGetOption(const char *message){
	std::string temp;
	std::cout << message;
	std::getline(std::cin, temp);
	return temp;
}